

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_enum_support.cpp
# Opt level: O0

void Am_Enum_Print_Helper(ostream *out,Am_ID_Tag type,long value)

{
  undefined1 local_38 [8];
  Am_Value v;
  Am_Type_Support *support;
  long value_local;
  Am_ID_Tag type_local;
  ostream *out_local;
  
  v.value.wrapper_value = (Am_Wrapper *)Am_Find_Support(type);
  if (v.value.wrapper_value == (Am_Wrapper *)0x0) {
    Am_Standard_Print(out,value,type);
  }
  else {
    Am_Value::Am_Value((Am_Value *)local_38,value,type);
    (**((v.value.wrapper_value)->super_Am_Registered_Type)._vptr_Am_Registered_Type)
              (v.value.wrapper_value,out,(Am_Value *)local_38);
    Am_Value::~Am_Value((Am_Value *)local_38);
  }
  return;
}

Assistant:

void
Am_Enum_Print_Helper(std::ostream &out, Am_ID_Tag type, long value)
{
  Am_Type_Support *support = Am_Find_Support(type);
  if (support) {
    Am_Value v(value, type);
    support->Print(out, v);
  } else
    Am_Standard_Print(out, (unsigned long)value, type);
}